

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int lhUnlinkCell(lhcell *pCell)

{
  lhpage *pPage_00;
  lhcell *plVar1;
  int rc;
  lhcell *pPrev;
  sxu16 nByte;
  lhpage *pPage;
  lhash_kv_engine *pEngine;
  lhcell *pCell_local;
  
  pPage_00 = pCell->pPage;
  pPrev._6_2_ = 0x1a;
  pCell_local._4_4_ = (*pCell->pPage->pHash->pIo->xWrite)(pPage_00->pRaw);
  if (pCell_local._4_4_ == 0) {
    plVar1 = lhFindSibeling(pCell);
    if (plVar1 == (lhcell *)0x0) {
      (pPage_00->sHdr).iOfft = pCell->iNext;
      SyBigEndianPack16(pPage_00->pRaw->zData,pCell->iNext);
    }
    else {
      plVar1->iNext = pCell->iNext;
      SyBigEndianPack16(pPage_00->pRaw->zData + (int)(plVar1->iStart + 0x10),pCell->iNext);
    }
    if (pCell->iOvfl == 0) {
      pPrev._6_2_ = (short)pCell->nData + (short)pCell->nKey + 0x1a;
    }
    lhRestoreSpace(pPage_00,pCell->iStart,pPrev._6_2_);
    lhCellDiscard(pCell);
    pCell_local._4_4_ = 0;
  }
  return pCell_local._4_4_;
}

Assistant:

static int lhUnlinkCell(lhcell *pCell)
{
	lhash_kv_engine *pEngine = pCell->pPage->pHash;
	lhpage *pPage = pCell->pPage;
	sxu16 nByte = L_HASH_CELL_SZ;
	lhcell *pPrev;
	int rc;
	rc = pEngine->pIo->xWrite(pPage->pRaw);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	/* Bring the link */
	pPrev = lhFindSibeling(pCell);
	if( pPrev ){
		pPrev->iNext = pCell->iNext;
		/* Fix offsets in the page header */
		SyBigEndianPack16(&pPage->pRaw->zData[pPrev->iStart + 4/*Hash*/+4/*Key*/+8/*Data*/],pCell->iNext);
	}else{
		/* First entry on this page (either master or slave) */
		pPage->sHdr.iOfft = pCell->iNext;
		/* Update the page header */
		SyBigEndianPack16(pPage->pRaw->zData,pCell->iNext);
	}
	/* Restore cell space */
	if( pCell->iOvfl == 0 ){
		nByte += (sxu16)(pCell->nData + pCell->nKey);
	}
	lhRestoreSpace(pPage,pCell->iStart,nByte);
	/* Discard the cell from the in-memory hashtable */
	lhCellDiscard(pCell);
	return UNQLITE_OK;
}